

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.cpp
# Opt level: O1

void anon_unknown.dwarf_292481::PulsePlayback::sinkInfoCallbackC
               (pa_context *context,pa_sink_info *info,int eol,void *pdata)

{
  pa_channel_map *ppVar1;
  long lVar2;
  int iVar3;
  undefined1 *puVar4;
  bool bVar5;
  char chanmap_str [336];
  undefined1 auStack_178 [344];
  
  if (eol != 0) {
    std::condition_variable::notify_all();
    return;
  }
  ppVar1 = &info->channel_map;
  iVar3 = (*(anonymous_namespace)::ppa_channel_map_superset)(ppVar1);
  if (iVar3 == 0) {
    iVar3 = (*(anonymous_namespace)::ppa_channel_map_superset)(ppVar1);
    if (iVar3 == 0) {
      iVar3 = (*(anonymous_namespace)::ppa_channel_map_superset)(ppVar1);
      if (iVar3 == 0) {
        iVar3 = (*(anonymous_namespace)::ppa_channel_map_superset)(ppVar1);
        if (iVar3 == 0) {
          iVar3 = (*(anonymous_namespace)::ppa_channel_map_superset)(ppVar1);
          if (iVar3 == 0) {
            iVar3 = (*(anonymous_namespace)::ppa_channel_map_superset)(ppVar1);
            if (iVar3 == 0) {
              iVar3 = (*(anonymous_namespace)::ppa_channel_map_superset)(ppVar1);
              puVar4 = &DAT_001950a0;
              if (iVar3 == 0) {
                puVar4 = &(anonymous_namespace)::StereoChanMap;
              }
            }
            else {
              puVar4 = &DAT_00195018;
            }
          }
          else {
            puVar4 = &DAT_00194f90;
          }
        }
        else {
          puVar4 = &DAT_00194f08;
        }
      }
      else {
        puVar4 = &DAT_00194e80;
      }
    }
    else {
      puVar4 = &DAT_00194df8;
    }
  }
  else {
    puVar4 = &(anonymous_namespace)::PulsePlayback::
              sinkInfoCallback(pa_context*,pa_sink_info_const*,int)::chanmaps;
  }
  if (puVar4 == &(anonymous_namespace)::StereoChanMap) {
    memset(auStack_178,0,0x150);
    (*(anonymous_namespace)::ppa_channel_map_snprint)(auStack_178,0x150,ppVar1);
    if (1 < (int)gLogLevel) {
      fprintf((FILE *)gLogFile,"[ALSOFT] (WW) Failed to find format for channel map:\n    %s\n",
              auStack_178);
    }
  }
  else if ((*(byte *)(*(long *)((long)pdata + 8) + 0x48) & 2) == 0) {
    *(undefined1 *)(*(long *)((long)pdata + 8) + 0x18) = *puVar4;
  }
  if ((info->active_port != (pa_sink_port_info *)0x0) && (2 < (int)gLogLevel)) {
    _GLOBAL__N_1::PulsePlayback::sinkInfoCallbackC((PulsePlayback *)info->active_port);
  }
  lVar2 = *(long *)((long)pdata + 8);
  if ((*(char *)(lVar2 + 0x18) == '\x01') && (info->active_port != (pa_sink_port_info *)0x0)) {
    iVar3 = strcmp(info->active_port->name,"analog-output-headphones");
    bVar5 = iVar3 == 0;
  }
  else {
    bVar5 = false;
  }
  *(bool *)(lVar2 + 0x1a) = bVar5;
  return;
}

Assistant:

static void sinkInfoCallbackC(pa_context *context, const pa_sink_info *info, int eol, void *pdata) noexcept
    { static_cast<PulsePlayback*>(pdata)->sinkInfoCallback(context, info, eol); }